

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

void __thiscall
duckdb::EncryptionTransport::EncryptionTransport
          (EncryptionTransport *this,TProtocol *prot_p,string *key,EncryptionUtil *encryption_util_p
          )

{
  Allocator *allocator;
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->super_TTransport)._vptr_TTransport = (_func_int **)&PTR__EncryptionTransport_017bd438;
  this->prot = prot_p;
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_30,
               &(prot_p->ptrans_).
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  this->trans = local_30._M_ptr;
  (**encryption_util_p->_vptr_EncryptionUtil)(&this->aes,encryption_util_p,key);
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&this->allocator,allocator,0x1000);
  Initialize(this,key);
  return;
}

Assistant:

EncryptionTransport(TProtocol &prot_p, const string &key, const EncryptionUtil &encryption_util_p)
	    : prot(prot_p), trans(*prot.getTransport()), aes(encryption_util_p.CreateEncryptionState(&key)),
	      allocator(Allocator::DefaultAllocator(), ParquetCrypto::CRYPTO_BLOCK_SIZE) {
		Initialize(key);
	}